

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleComputeInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageSampleComputeInstance *this)

{
  ChannelOrder *pCVar1;
  float fVar2;
  ShaderInputInterface SVar3;
  DescriptorUpdateMethod DVar4;
  Allocation *pAVar5;
  TextureFormat *pTVar6;
  bool bVar7;
  void *pvVar8;
  undefined1 auVar9 [8];
  undefined1 auVar10 [8];
  int i;
  size_t sVar11;
  ostream *poVar12;
  VkDescriptorUpdateTemplateKHR updateTemplate;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  deUint32 dVar16;
  long lVar17;
  int resultNdx;
  uint samplePosNdx;
  int samplePosNdx_00;
  char *pcVar18;
  ComputePipeline *pCVar19;
  TestStatus *pTVar20;
  ComputePipeline *pImmutableSamplers;
  pointer rawUpdateData;
  VkDescriptorSetLayout *descriptorSetLayouts;
  bool bVar21;
  bool bVar22;
  float fVar23;
  Vector<bool,_4> res_1;
  Vec4 result;
  ComputePipeline pipeline;
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Vector<float,_4> res;
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Vec4 reference;
  ostringstream msg;
  Vec4 results [4];
  VkDescriptorSet descriptorSets [1];
  Vec4 samplingThreshold;
  undefined1 auStack_488 [12];
  char local_47c [4];
  TextureFormat local_478;
  TextureFormat TStack_470;
  TestStatus *local_460;
  ComputePipeline local_458;
  VkDescriptorSetLayout local_418;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_410;
  undefined1 local_3f8 [64];
  undefined1 local_3b8 [8];
  TextureFormat TStack_3b0;
  TextureFormat local_3a8;
  ChannelOrder CStack_3a0;
  ChannelType CStack_39c;
  ComputePipeline *local_398;
  pointer local_390;
  pointer local_388;
  pointer local_378;
  ios_base local_340 [264];
  TextureFormat local_238;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_230;
  Vector<float,_4> local_218;
  undefined1 local_208 [40];
  uint local_1e0;
  uint local_1dc;
  VkDevice local_1d8;
  int local_1d0;
  TextureFormat local_1c8;
  int local_1c0;
  VkBufferMemoryBarrier *local_1b8;
  int local_1b0;
  VkBufferMemoryBarrier *local_1a8;
  ios_base local_198 [272];
  TextureFormat local_88 [4];
  Handle<(vk::HandleType)20> local_68;
  TextureFormat TStack_60;
  TextureFormat local_58;
  TextureFormat TStack_50;
  Handle<(vk::HandleType)20> local_48;
  float afStack_40 [4];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,"Accessing resource in a compute program.\n",0x29);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Single descriptor set. Descriptor set contains ",0x2f);
    SVar3 = this->m_shaderInterface;
    if (SVar3 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      pcVar18 = "single";
    }
    else if (SVar3 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pcVar18 = "two";
    }
    else {
      pcVar18 = (char *)0x0;
      if (SVar3 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar18 = "an array (size 2) of";
      }
    }
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)auStack_488 + (int)*(undefined8 *)(local_208._0_8_ - 0x18) + 0x280);
    }
    else {
      sVar11 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,sVar11);
    }
    lVar17 = 0x3a;
    pcVar18 = " VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER descriptor(s).\n";
LAB_0051e785:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar17);
  }
  else if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Single descriptor set. Descriptor set contains ",0x2f);
    SVar3 = this->m_shaderInterface;
    if (SVar3 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
      pcVar18 = "single";
    }
    else if (SVar3 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pcVar18 = "two";
    }
    else {
      pcVar18 = (char *)0x0;
      if (SVar3 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        pcVar18 = "an array (size 2) of";
      }
    }
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)auStack_488 + (int)*(undefined8 *)(local_208._0_8_ - 0x18) + 0x280);
    }
    else {
      sVar11 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,sVar11);
    }
    lVar17 = 0x40;
    pcVar18 = " VK_DESCRIPTOR_TYPE_SAMPLER descriptor(s) and a single texture.\n";
    goto LAB_0051e785;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,"Image view type is ",0x13);
  pcVar18 = ::vk::getImageViewTypeName(this->m_viewType);
  if (pcVar18 == (char *)0x0) {
    std::ios::clear((int)auStack_488 + (int)*(undefined8 *)(local_208._0_8_ - 0x18) + 0x280);
  }
  else {
    sVar11 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\n",1);
  if (this->m_baseMipLevel != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Image view base mip level = ",0x1c);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  }
  if (this->m_baseArraySlice != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Image view base array slice = ",0x1e);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  }
  bVar22 = this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR;
  pcVar18 = "Sampler 0 mode is LINEAR, with WRAP\nSampler 1 mode is NEAREST with CLAMP\n";
  if (bVar22) {
    pcVar18 = "Sampler mode is LINEAR, with WRAP\n";
  }
  lVar17 = 0x49;
  if (bVar22) {
    lVar17 = 0x22;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar17);
  samplePosNdx = 0;
  local_460 = __return_storage_ptr__;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Test sample ",0xc);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_208,samplePosNdx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": sample at position ",0x15);
    ImageSampleInstanceImages::getSamplePos
              ((ImageSampleInstanceImages *)local_3b8,this->m_viewType,this->m_baseMipLevel,
               this->m_baseArraySlice,samplePosNdx);
    tcu::operator<<(poVar12,(Vector<float,_4> *)local_3b8);
    if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
      if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
        lVar17 = 0x1d;
        pcVar18 = " from combined image sampler ";
      }
      else {
        if (this->m_descriptorType != VK_DESCRIPTOR_TYPE_SAMPLER) goto LAB_0051e988;
        lVar17 = 0xf;
        pcVar18 = " using sampler ";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar17);
      std::ostream::operator<<((ostream *)local_208,samplePosNdx & 1);
    }
LAB_0051e988:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\n",1);
    samplePosNdx = samplePosNdx + 1;
  } while (samplePosNdx != 4);
  local_3b8 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_3b0);
  pCVar19 = &local_458;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&TStack_3b0,
             (char *)local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                     m_data.object.m_internal,
             (long)local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                   deleter.m_deviceIface);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((VkDevice *)
      local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
      m_internal !=
      &local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
       m_device) {
    operator_delete((void *)local_458.m_pipelineLayout.
                            super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
                    (ulong)(local_458.m_pipelineLayout.
                            super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device +
                           1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_3b0);
  std::ios_base::~ios_base(local_340);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base(local_198);
  local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal
       = (this->m_images).m_samplerA.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
         m_internal;
  local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       (this->m_images).m_samplerB.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.
       m_internal;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_3b8);
  DVar4 = this->m_updateMethod;
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_3b8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
             (VkSampler *)0x0);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    ::vk::DescriptorSetLayoutBuilder::addBinding
              ((DescriptorSetLayoutBuilder *)local_3b8,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,1,0x20,
               (VkSampler *)0x0);
  }
  SVar3 = this->m_shaderInterface;
  if (SVar3 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    dVar16 = 2;
  }
  else if (SVar3 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    pCVar19 = &local_458;
    if ((this->m_images).m_isImmutable == false) {
      pCVar19 = (ComputePipeline *)0x0;
    }
    dVar16 = 1;
    ::vk::DescriptorSetLayoutBuilder::addBinding
              ((DescriptorSetLayoutBuilder *)local_3b8,this->m_descriptorType,1,0x20,
               (VkSampler *)pCVar19);
    pCVar19 = (ComputePipeline *)
              &local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
               deleter;
  }
  else {
    if (SVar3 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_0051eb4f;
    dVar16 = 1;
  }
  pImmutableSamplers = (ComputePipeline *)0x0;
  if ((this->m_images).m_isImmutable != false) {
    pImmutableSamplers = pCVar19;
  }
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_3b8,this->m_descriptorType,dVar16,0x20,
             (VkSampler *)pImmutableSamplers);
LAB_0051eb4f:
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_208,
             (DescriptorSetLayoutBuilder *)local_3b8,this->m_vki,this->m_device,
             (uint)((DVar4 & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
                   DESCRIPTOR_UPDATE_METHOD_WITH_PUSH));
  if (local_388 != (pointer)0x0) {
    operator_delete(local_388,(long)local_378 - (long)local_388);
  }
  pvVar8 = (void *)CONCAT44(CStack_39c,CStack_3a0);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,(long)local_390 - (long)pvVar8);
  }
  if ((TextureFormat)local_3b8 != (TextureFormat)0x0) {
    operator_delete((void *)local_3b8,(long)local_3a8 - (long)local_3b8);
  }
  local_418.m_internal = local_208._0_8_;
  DStack_410.m_deviceIface = (DeviceInterface *)local_208._8_8_;
  DStack_410.m_device = (VkDevice)local_208._16_8_;
  DStack_410.m_allocator = (VkAllocationCallbacks *)local_208._24_8_;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_208);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_208,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  dVar16 = 0;
  if ((ulong)this->m_shaderInterface < 4) {
    dVar16 = *(deUint32 *)(&DAT_00aea800 + (ulong)this->m_shaderInterface * 4);
  }
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_208,this->m_descriptorType,dVar16);
  if (this->m_descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER) {
    ::vk::DescriptorPoolBuilder::addType
              ((DescriptorPoolBuilder *)local_208,VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE,1);
  }
  descriptorSetLayouts = (VkDescriptorSetLayout *)&DAT_00000001;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_3b8,(DescriptorPoolBuilder *)local_208,
             this->m_vki,this->m_device,1,1);
  if ((void *)local_208._0_8_ != (void *)0x0) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
  }
  auVar9 = local_3b8;
  local_238.order = local_3b8._0_4_;
  local_238.type = local_3b8._4_4_;
  DStack_230.m_deviceIface = (DeviceInterface *)TStack_3b0;
  DStack_230.m_device = (VkDevice)local_3a8;
  local_398 = &local_458;
  local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal
       = local_418.m_internal;
  local_3b8._0_4_ = 0x22;
  auVar10 = local_3b8;
  TStack_3b0.order = R;
  TStack_3b0.type = SNORM_INT8;
  local_3b8._0_4_ = auVar9._0_4_;
  local_3b8._4_4_ = auVar9._4_4_;
  local_3a8.order = local_3b8._0_4_;
  local_3a8.type = local_3b8._4_4_;
  CStack_3a0 = A;
  local_3b8 = auVar10;
  if ((this->m_updateMethod & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
      DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    local_208._16_8_ = (pointer)0x0;
    local_208._24_8_ = (VkAllocationCallbacks *)0x0;
    local_208._0_8_ = (TextureFormat *)0x0;
    local_208._8_4_ = R;
    local_208._12_4_ = SNORM_INT8;
  }
  else {
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)local_208,this->m_vki,this->m_device,
               (VkDescriptorSetAllocateInfo *)local_3b8);
    writeDescriptorSet(this,(VkDescriptorSet)local_208._0_8_,
                       (VkDescriptorSetLayout)
                       local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                       m_data.object.m_internal,(VkPipelineLayout)0x0);
  }
  local_3f8._16_8_ = local_208._0_8_;
  local_3f8._24_8_ = local_208._8_8_;
  local_3f8._32_8_ = local_208._16_8_;
  local_3f8._40_8_ = local_208._24_8_;
  ComputePipeline::ComputePipeline
            (&local_458,this->m_vki,this->m_device,
             ((this->super_TestInstance).m_context)->m_progCollection,(deUint32)&local_418,
             descriptorSetLayouts);
  local_1d8 = (VkDevice)&local_48;
  local_48.m_internal = local_3f8._16_8_;
  DVar4 = this->m_updateMethod;
  local_208._0_8_ = this->m_vki;
  local_208._8_8_ = this->m_device;
  local_208._16_8_ =
       local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_208._24_8_ =
       local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  local_208._32_8_ = 0x100000004;
  local_1e0 = 1;
  local_1a8 = &(this->m_result).m_bufferBarrier;
  local_1dc = (uint)(DVar4 - DESCRIPTOR_UPDATE_METHOD_LAST < 0xfffffffe);
  rawUpdateData = (pointer)0x0;
  local_1d0 = 0;
  local_1c8.order = R;
  local_1c8.type = SNORM_INT8;
  local_1c0 = 0;
  local_1b8 = (VkBufferMemoryBarrier *)0x0;
  local_1b0 = 1;
  local_58 = (TextureFormat)0x0;
  TStack_50 = (TextureFormat)0x0;
  local_68.m_internal = 0;
  TStack_60 = (TextureFormat)0x0;
  local_88[2] = (TextureFormat)0x0;
  local_88[3].order = MODE_DEPTH;
  local_88[3].type = 0;
  local_88[0].order = R;
  local_88[0].type = SNORM_INT8;
  local_88[1].order = R;
  local_88[1].type = SNORM_INT8;
  if (DVar4 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    writeDescriptorSet(this,(VkDescriptorSet)0x0,local_418,
                       (VkPipelineLayout)
                       local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                       m_data.object.m_internal);
    ComputeCommand::submitAndWait
              ((ComputeCommand *)local_208,this->m_queueFamilyIndex,this->m_queue,
               &this->m_updateBuilder);
  }
  else {
    updateTemplate.m_internal = 0;
    if (DVar4 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
      writeDescriptorSet(this,(VkDescriptorSet)0x0,local_418,
                         (VkPipelineLayout)
                         local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                         m_data.object.m_internal);
      updateTemplate.m_internal =
           (this->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal;
      rawUpdateData =
           (this->m_updateRegistry).m_updateEntries.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ComputeCommand::submitAndWait
              ((ComputeCommand *)local_208,this->m_queueFamilyIndex,this->m_queue,updateTemplate,
               rawUpdateData);
  }
  pAVar5 = (this->m_result).m_bufferMem.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            ((this->m_result).m_vki,(this->m_result).m_device,
             (VkDeviceMemory)(pAVar5->m_memory).m_internal,pAVar5->m_offset,0x40);
  pTVar6 = (TextureFormat *)
           ((this->m_result).m_bufferMem.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  local_58 = pTVar6[6];
  TStack_50 = pTVar6[7];
  local_68.m_internal._0_4_ = pTVar6[4].order;
  local_68.m_internal._4_4_ = pTVar6[4].type;
  TStack_60 = pTVar6[5];
  local_88[2] = pTVar6[2];
  local_88[3] = pTVar6[3];
  local_88[0] = *pTVar6;
  local_88[1] = pTVar6[1];
  local_3f8._56_8_ = &this->m_images;
  lVar17 = 0;
  bVar21 = true;
  samplePosNdx_00 = 0;
  bVar22 = false;
  do {
    local_478 = local_88[lVar17 * 2];
    TStack_470 = local_88[lVar17 * 2 + 1];
    ImageSampleInstanceImages::fetchSampleValue
              ((ImageSampleInstanceImages *)&local_218,(int)local_3f8._56_8_);
    lVar13 = 0;
    do {
      afStack_40[lVar13] = 0.03137255;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    lVar13 = 0;
    do {
      *(undefined4 *)(local_3b8 + lVar13 * 4) = 0xbf800000;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    bVar7 = true;
    if (((float)local_478.order == (float)local_3b8._0_4_) &&
       (!NAN((float)local_478.order) && !NAN((float)local_3b8._0_4_))) {
      uVar14 = 0xffffffffffffffff;
      while (uVar14 != 2) {
        lVar13 = uVar14 + 2;
        uVar15 = uVar14 + 1;
        pCVar1 = &TStack_3b0.order + uVar14;
        if (((float)(&local_478.order)[lVar13] != (float)*pCVar1) ||
           (uVar14 = uVar15, NAN((float)(&local_478.order)[lVar13]) || NAN((float)*pCVar1)))
        goto LAB_0051efe9;
      }
      uVar15 = 3;
LAB_0051efe9:
      bVar7 = bVar22;
      if (uVar15 < 3) {
        bVar7 = true;
      }
    }
    local_3f8._0_4_ = VK_IMAGE_VIEW_TYPE_1D;
    local_3f8._4_4_ = 0;
    local_3f8._8_4_ = 0;
    local_3f8._12_4_ = R;
    lVar13 = 0;
    do {
      *(float *)(local_3f8 + lVar13 * 4) =
           (float)(&local_478.order)[lVar13] - local_218.m_data[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_3b8 = (undefined1  [8])0x0;
    TStack_3b0.order = R;
    TStack_3b0.type = SNORM_INT8;
    lVar13 = 0;
    do {
      fVar2 = *(float *)(local_3f8 + lVar13 * 4);
      fVar23 = -fVar2;
      if (-fVar2 <= fVar2) {
        fVar23 = fVar2;
      }
      *(float *)(local_3b8 + lVar13 * 4) = fVar23;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_47c[0] = '\0';
    local_47c[1] = '\0';
    local_47c[2] = '\0';
    local_47c[3] = '\0';
    lVar13 = 0;
    do {
      local_47c[lVar13] =
           afStack_40[lVar13] <= *(float *)(local_3b8 + lVar13 * 4) &&
           *(float *)(local_3b8 + lVar13 * 4) != afStack_40[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    if (local_47c[0] == '\0') {
      uVar14 = 0xffffffffffffffff;
      do {
        if (uVar14 == 2) {
          uVar15 = 3;
          break;
        }
        uVar15 = uVar14 + 1;
        lVar13 = uVar14 + 2;
        uVar14 = uVar15;
      } while (local_47c[lVar13] != '\x01');
      if (uVar15 < 3) goto LAB_0051f0b7;
    }
    else {
LAB_0051f0b7:
      local_3b8 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_3b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_3b0,"Test sample ",0xc);
      std::ostream::operator<<(&TStack_3b0,samplePosNdx_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_3b0,":\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_3b0,"\tSampling at ",0xd);
      ImageSampleInstanceImages::getSamplePos
                ((ImageSampleInstanceImages *)local_3f8,this->m_viewType,this->m_baseMipLevel,
                 this->m_baseArraySlice,samplePosNdx_00);
      tcu::operator<<((ostream *)&TStack_3b0,(Vector<float,_4> *)local_3f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_3b0,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_3b0,"\tError expected ",0x10);
      tcu::operator<<((ostream *)&TStack_3b0,&local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_3b0,", got ",6);
      tcu::operator<<((ostream *)&TStack_3b0,(Vector<float,_4> *)&local_478);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_3b0);
      std::ios_base::~ios_base(local_340);
      bVar21 = false;
    }
    pTVar20 = local_460;
    samplePosNdx_00 = samplePosNdx_00 + 1;
    lVar17 = lVar17 + 1;
    bVar22 = bVar7;
    if (lVar17 == 4) {
      if (bVar21) {
        local_3b8 = (undefined1  [8])&local_3a8;
        TStack_3b0.order = LA;
        TStack_3b0.type = SNORM_INT8;
        local_3a8._0_5_ = 0x73736150;
        local_460->m_code = QP_TEST_RESULT_PASS;
        (local_460->m_description)._M_dataplus._M_p = (pointer)&(local_460->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_460->m_description,local_3b8);
      }
      else if (bVar7) {
        local_3b8 = (undefined1  [8])&local_3a8;
        local_478.order = CHANNELORDER_LAST;
        local_478.type = SNORM_INT8;
        local_3b8 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)&local_478);
        pTVar20 = local_460;
        local_3a8 = local_478;
        ((pointer)local_3b8)->binding = 0x61766e49;
        ((pointer)local_3b8)->descriptorType = 0x2064696c;
        ((pointer)local_3b8)->descriptorCount = 0x75736572;
        ((pointer)local_3b8)->stageFlags = 0x7620746c;
        *(undefined8 *)((long)&((pointer)local_3b8)->stageFlags + 1) = 0x7365756c61762074;
        TStack_3b0 = local_478;
        *(undefined1 *)((long)&((pointer)local_3b8)->binding + (long)local_478) = 0;
        local_460->m_code = QP_TEST_RESULT_FAIL;
        (local_460->m_description)._M_dataplus._M_p = (pointer)&(local_460->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_460->m_description,local_3b8,
                   (long)&((pointer)local_3b8)->binding + (long)local_478);
      }
      else {
        local_3b8 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&TStack_3b0,"Result buffer was not written to.",0x21);
        pTVar20 = local_460;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_3b0);
        std::ios_base::~ios_base(local_340);
        local_3b8 = (undefined1  [8])&local_3a8;
        local_478.order = 0x20;
        local_478.type = SNORM_INT8;
        local_3b8 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)&local_478);
        local_3a8 = local_478;
        ((pointer)local_3b8)->pImmutableSamplers = (VkSampler *)0x727720746f6e2073;
        *(undefined8 *)((long)local_3b8 + 0x18) = 0x6f74206e65747469;
        ((pointer)local_3b8)->binding = 0x75736552;
        ((pointer)local_3b8)->descriptorType = 0x6220746c;
        ((pointer)local_3b8)->descriptorCount = 0x65666675;
        ((pointer)local_3b8)->stageFlags = 0x61772072;
        TStack_3b0 = local_478;
        *(undefined1 *)((long)&((pointer)local_3b8)->binding + (long)local_478) = 0;
        pTVar20->m_code = QP_TEST_RESULT_FAIL;
        (pTVar20->m_description)._M_dataplus._M_p = (pointer)&(pTVar20->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar20->m_description,local_3b8,
                   (long)&((pointer)local_3b8)->binding + (long)local_478);
      }
      if (local_3b8 != (undefined1  [8])&local_3a8) {
        operator_delete((void *)local_3b8,(long)local_3a8 + 1);
      }
      if (local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
          m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                    deleter,(VkPipeline)
                            local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
                            m_data.object.m_internal);
      }
      local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)0x0;
      local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           0;
      local_458.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)0x0;
      if (local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
          m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  (&local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data
                    .deleter,
                   (VkPipelineLayout)
                   local_458.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                   object.m_internal);
      }
      if ((pointer)local_3f8._16_8_ != (pointer)0x0) {
        local_3b8 = (undefined1  [8])local_3f8._16_8_;
        (**(_func_int **)((long)*(VkDescriptorPoolSize *)local_3f8._24_8_ + 0x1e8))
                  (local_3f8._24_8_,local_3f8._32_8_,local_3f8._40_8_,1);
      }
      if (local_238 != (TextureFormat)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&DStack_230,(VkDescriptorPool)local_238);
      }
      if (local_418.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_410,local_418);
      }
      return pTVar20;
    }
  } while( true );
}

Assistant:

tcu::TestStatus ImageSampleComputeInstance::iterate (void)
{
	logTestPlan();
	return testResourceAccess();
}